

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void modify_arm_cp_regs_aarch64(ARMCPRegInfo_conflict *regs,ARMCPRegUserSpaceInfo *mods)

{
  ARMCPRegInfo_conflict *pAVar1;
  gchar *pattern;
  ARMCPRegInfo_conflict *pAVar2;
  gboolean gVar3;
  int iVar4;
  GPatternSpec *pspec;
  
  pattern = mods->name;
  do {
    if (pattern == (gchar *)0x0) {
      return;
    }
    if (mods->is_glob == true) {
      pspec = g_pattern_spec_new(pattern);
    }
    else {
      pspec = (GPatternSpec *)0x0;
    }
    iVar4 = regs->type;
    pAVar1 = regs;
    while (iVar4 != 0xfffff) {
      if ((pspec == (GPatternSpec *)0x0) ||
         (gVar3 = g_pattern_match_string(pspec,pAVar1->name), gVar3 == 0)) {
        iVar4 = strcmp(pAVar1->name,mods->name);
        if (iVar4 == 0) {
          pAVar1->type = 2;
          pAVar1->access = 0xa8;
          pAVar1->resetvalue = pAVar1->resetvalue & mods->exported_bits | mods->fixed_bits;
          break;
        }
      }
      else {
        pAVar1->type = 2;
        pAVar1->access = 0xa8;
        pAVar1->resetvalue = 0;
      }
      pAVar2 = pAVar1 + 1;
      pAVar1 = pAVar1 + 1;
      iVar4 = pAVar2->type;
    }
    if (pspec != (GPatternSpec *)0x0) {
      g_pattern_spec_free(pspec);
    }
    pattern = mods[1].name;
    mods = mods + 1;
  } while( true );
}

Assistant:

void modify_arm_cp_regs(ARMCPRegInfo *regs, const ARMCPRegUserSpaceInfo *mods)
{
    const ARMCPRegUserSpaceInfo *m;
    ARMCPRegInfo *r;

    for (m = mods; m->name; m++) {
        GPatternSpec *pat = NULL;
        if (m->is_glob) {
            pat = g_pattern_spec_new(m->name);
        }
        for (r = regs; r->type != ARM_CP_SENTINEL; r++) {
            if (pat && g_pattern_match_string(pat, r->name)) {
                r->type = ARM_CP_CONST;
                r->access = PL0U_R;
                r->resetvalue = 0;
                /* continue */
            } else if (strcmp(r->name, m->name) == 0) {
                r->type = ARM_CP_CONST;
                r->access = PL0U_R;
                r->resetvalue &= m->exported_bits;
                r->resetvalue |= m->fixed_bits;
                break;
            }
        }
        if (pat) {
            g_pattern_spec_free(pat);
        }
    }
}